

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O0

bool __thiscall
CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator==(queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *o)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  int local_24;
  int i;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *o_local;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  sVar2 = size(this);
  sVar3 = size(o);
  if (sVar2 == sVar3) {
    for (local_24 = 0; (ulong)(long)local_24 < this->mSize; local_24 = local_24 + 1) {
      bVar1 = std::operator!=(this->mData + (this->mFront + (long)local_24) % this->mCap,
                              o->mData + (o->mFront + (long)local_24) % o->mCap);
      if (bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CP::queue<T>::operator==(const CP::queue<T> &o) const {
    if (size() != o.size())
        return 0;
    for (int i = 0; i < mSize; ++i) {
        if (mData[(mFront + i) % mCap] != o.mData[(o.mFront + i) % o.mCap])
            return 0;
    }
    return 1;
}